

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_utf8.cxx
# Opt level: O3

int Toupper(int ucs)

{
  unsigned_short *puVar1;
  int iVar2;
  unsigned_short *puVar3;
  long lVar4;
  unsigned_short uVar5;
  unsigned_short uVar6;
  unsigned_short uVar7;
  unsigned_short uVar8;
  unsigned_short uVar9;
  unsigned_short uVar10;
  unsigned_short uVar11;
  unsigned_short uVar12;
  
  if (Toupper::table == (unsigned_short *)0x0) {
    puVar3 = (unsigned_short *)malloc(0x20000);
    uVar5 = 0;
    uVar6 = 1;
    uVar7 = 2;
    uVar8 = 3;
    uVar9 = 4;
    uVar10 = 5;
    uVar11 = 6;
    uVar12 = 7;
    lVar4 = 0;
    Toupper::table = puVar3;
    do {
      puVar1 = puVar3 + lVar4;
      *puVar1 = uVar5;
      puVar1[1] = uVar6;
      puVar1[2] = uVar7;
      puVar1[3] = uVar8;
      puVar1[4] = uVar9;
      puVar1[5] = uVar10;
      puVar1[6] = uVar11;
      puVar1[7] = uVar12;
      lVar4 = lVar4 + 8;
      uVar5 = uVar5 + 8;
      uVar6 = uVar6 + 8;
      uVar7 = uVar7 + 8;
      uVar8 = uVar8 + 8;
      uVar9 = uVar9 + 8;
      uVar10 = uVar10 + 8;
      uVar11 = uVar11 + 8;
      uVar12 = uVar12 + 8;
    } while (lVar4 != 0x10000);
    lVar4 = 0;
    do {
      iVar2 = XUtf8Tolower((int)lVar4);
      if (lVar4 != iVar2) {
        Toupper::table[iVar2] = (unsigned_short)lVar4;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x10000);
  }
  if ((uint)ucs < 0x10000) {
    ucs = (int)Toupper::table[(uint)ucs];
  }
  return ucs;
}

Assistant:

static int Toupper(int ucs) {
  long i;
  static unsigned short *table = NULL;

  if (!table) {
    table = (unsigned short*) malloc(
	    sizeof(unsigned short) * (NBC));
    for (i = 0; i < NBC; i++) {
      table[i] = (unsigned short) i;
    }
    for (i = 0; i < NBC; i++) {
      int l;
      l = XUtf8Tolower(i);
      if (l != i) table[l] = (unsigned short) i;
    }
  }
  if (ucs >= NBC || ucs < 0) return ucs;
  return table[ucs];
}